

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
 __thiscall ninx::parser::Parser::parse_level_1_expression(Parser *this)

{
  int iVar1;
  function<std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>_()>
  *in_RSI;
  long lVar2;
  initializer_list<ninx::parser::OperatorCaseDefinition> __l;
  allocator_type local_129;
  vector<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
  local_128;
  code *pcStack_110;
  long *local_108;
  long local_100;
  long local_f8 [2];
  long *local_e8;
  long local_e0;
  long local_d8 [2];
  vector<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
  local_c8;
  OperatorCaseDefinition local_b0;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined8 local_50;
  undefined8 uStack_48;
  code *local_40;
  code *local_38;
  
  if (parse_level_1_expression()::level_1_operators == '\0') {
    iVar1 = __cxa_guard_acquire(&parse_level_1_expression()::level_1_operators);
    if (iVar1 != 0) {
      local_e8 = local_d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"*","");
      local_b0.op._M_dataplus._M_p = (pointer)&local_b0.op.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_e8,local_e0 + (long)local_e8);
      local_b0.builder.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
      local_b0.builder.super__Function_base._M_functor._8_8_ = 0;
      local_b0.builder._M_invoker =
           std::
           _Function_handler<std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>_(std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>,_std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/federico-terzi[P]ninx/lib/parser/Parser.cpp:283:13)>
           ::_M_invoke;
      local_b0.builder.super__Function_base._M_manager =
           std::
           _Function_handler<std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>_(std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>,_std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/federico-terzi[P]ninx/lib/parser/Parser.cpp:283:13)>
           ::_M_manager;
      local_108 = local_f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"/","");
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,local_108,local_100 + (long)local_108);
      local_50 = 0;
      uStack_48 = 0;
      local_38 = std::
                 _Function_handler<std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>_(std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>,_std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/federico-terzi[P]ninx/lib/parser/Parser.cpp:283:13)>
                 ::_M_invoke;
      local_40 = std::
                 _Function_handler<std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>_(std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>,_std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/federico-terzi[P]ninx/lib/parser/Parser.cpp:283:13)>
                 ::_M_manager;
      __l._M_len = 2;
      __l._M_array = &local_b0;
      std::
      vector<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
      ::vector(&parse_level_1_expression::level_1_operators,__l,&local_129);
      lVar2 = 0x40;
      do {
        OperatorCaseDefinition::~OperatorCaseDefinition
                  ((OperatorCaseDefinition *)((long)&local_b0.op._M_dataplus._M_p + lVar2));
        lVar2 = lVar2 + -0x40;
      } while (lVar2 != -0x40);
      if (local_108 != local_f8) {
        operator_delete(local_108,local_f8[0] + 1);
      }
      if (local_e8 != local_d8) {
        operator_delete(local_e8,local_d8[0] + 1);
      }
      __cxa_atexit(std::
                   vector<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
                   ::~vector,&parse_level_1_expression::level_1_operators,&__dso_handle);
      __cxa_guard_release(&parse_level_1_expression()::level_1_operators);
    }
  }
  local_128.
  super__Vector_base<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcStack_110 = std::
                _Function_handler<std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/federico-terzi[P]ninx/lib/parser/Parser.cpp:296:33)>
                ::_M_invoke;
  local_128.
  super__Vector_base<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/federico-terzi[P]ninx/lib/parser/Parser.cpp:296:33)>
                ::_M_manager;
  std::
  vector<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
  ::vector(&local_c8,&parse_level_1_expression::level_1_operators);
  parse_sub_expression(this,in_RSI,&local_128);
  std::
  vector<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
  ::~vector(&local_c8);
  if (local_128.
      super__Vector_base<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)local_128.
              super__Vector_base<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage)(&local_128,&local_128,3);
  }
  return (__uniq_ptr_data<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>,_true,_true>
          )(__uniq_ptr_data<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Expression> ninx::parser::Parser::parse_level_1_expression() {
    static std::vector<ninx::parser::OperatorCaseDefinition> level_1_operators = {
            build_operator_case<MultiplicationExpression>("*"),
            build_operator_case<DivisionExpression>("/")
    };

    return parse_sub_expression([this] {
        return parse_value();
    }, level_1_operators);
}